

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineSpecsOf.hpp
# Opt level: O2

LineSpecs * __thiscall
sciplot::LineSpecsOf<sciplot::LineSpecs>::lineColor
          (LineSpecsOf<sciplot::LineSpecs> *this,string *value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_50,"linecolor \'",value);
  std::operator+(&local_30,&local_50,"\'");
  std::__cxx11::string::operator=((string *)&this->m_linecolor,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return (LineSpecs *)this;
}

Assistant:

auto LineSpecsOf<DerivedSpecs>::lineColor(std::string value) -> DerivedSpecs&
{
    m_linecolor = "linecolor '" + value + "'";
    return static_cast<DerivedSpecs&>(*this);
}